

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O0

qint64 __thiscall QDataStream::readBlock(QDataStream *this,char *data,qint64 len)

{
  bool bVar1;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  QDataStream *in_RDI;
  qint64 readResult;
  void *local_8;
  
  if ((in_RDI->q_status == '\0') ||
     (bVar1 = QIODevice::isTransactionStarted((QIODevice *)0x484b48), !bVar1)) {
    local_8 = (void *)QIODevice::read(in_RDI->dev,in_ESI,in_RDX,in_RCX);
    if (local_8 != in_RDX) {
      setStatus(in_RDI,ReadPastEnd);
    }
  }
  else {
    local_8 = (void *)0xffffffffffffffff;
  }
  return (qint64)local_8;
}

Assistant:

qint64 QDataStream::readBlock(char *data, qint64 len)
{
    // Disable reads on failure in transacted stream
    if (q_status != Ok && dev->isTransactionStarted())
        return -1;

    const qint64 readResult = dev->read(data, len);
    if (readResult != len)
        setStatus(ReadPastEnd);
    return readResult;
}